

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_crl.cpp
# Opt level: O0

void WriteGeneralName(GeneralName *name)

{
  IA5String *this;
  GeneralNameType GVar1;
  ostream *poVar2;
  string local_220 [32];
  stringstream local_200 [8];
  stringstream strstm;
  ostream local_1f0 [392];
  string local_68 [8];
  string str;
  IA5String uri;
  GeneralNameType type;
  GeneralName *name_local;
  
  GVar1 = GeneralName::GetType(name);
  if ((5 < (uint)GVar1) && (GVar1 == uniformResourceIdentifier)) {
    this = (IA5String *)((long)&str.field_2 + 8);
    IA5String::IA5String(this);
    std::__cxx11::string::string(local_68);
    GeneralName::GetURI(name,this);
    std::__cxx11::stringstream::stringstream(local_200);
    operator<<(local_1f0,(IA5String *)((long)&str.field_2 + 8));
    std::__cxx11::stringstream::str();
    std::__cxx11::string::operator=(local_68,local_220);
    std::__cxx11::string::~string(local_220);
    poVar2 = std::operator<<((ostream *)&std::cout,"CRL URI: ");
    poVar2 = std::operator<<(poVar2,local_68);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::stringstream::~stringstream(local_200);
    std::__cxx11::string::~string(local_68);
    IA5String::~IA5String((IA5String *)((long)&str.field_2 + 8));
  }
  return;
}

Assistant:

void WriteGeneralName(const GeneralName& name)
{
    GeneralNameType type = name.GetType();

    switch(type)
    {
        case GeneralNameType::uniformResourceIdentifier:
            break;
            
        case GeneralNameType::OtherName:
        case GeneralNameType::rfc822Name:
        case GeneralNameType::dNSName:
        case GeneralNameType::x400Address:
        case GeneralNameType::directoryName:
        case GeneralNameType::ediPartyName:
        case GeneralNameType::iPAddress:
        case GeneralNameType::registeredID:
        default:
            return;
    }

    IA5String uri;
    std::string str;

    name.GetURI(uri);
    std::stringstream strstm;
    strstm << uri;
    str = strstm.str();

    std::cout << "CRL URI: " << str << std::endl;
}